

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

void omp_init_nest_lock_with_hint_(void **user_lock,uintptr_t *hint)

{
  kmp_info_t *pkVar1;
  uint gtid;
  void *unaff_retaddr;
  
  gtid = __kmp_get_global_thread_id_reg();
  if ((((-1 < (int)gtid & ompt_enabled._0_1_) == 1) &&
      (pkVar1 = __kmp_threads[gtid], pkVar1 != (kmp_info_t *)0x0)) &&
     ((pkVar1->th).ompt_thread_info.return_address == (void *)0x0)) {
    (pkVar1->th).ompt_thread_info.return_address = unaff_retaddr;
  }
  __kmpc_init_nest_lock_with_hint((ident_t *)0x0,gtid,user_lock,*hint);
  return;
}

Assistant:

void FTN_STDCALL FTN_INIT_NEST_LOCK_WITH_HINT(void **user_lock,
                                              uintptr_t KMP_DEREF hint) {
#ifdef KMP_STUB
  *((kmp_stub_lock_t *)user_lock) = UNLOCKED;
#else
  int gtid = __kmp_entry_gtid();
#if OMPT_SUPPORT && OMPT_OPTIONAL
  OMPT_STORE_RETURN_ADDRESS(gtid);
#endif
  __kmpc_init_nest_lock_with_hint(NULL, gtid, user_lock, KMP_DEREF hint);
#endif
}